

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

RAMBlock * qemu_get_ram_block(uc_struct_conflict15 *uc,ram_addr_t addr)

{
  RAMBlock *pRVar1;
  ram_addr_t rVar2;
  
  pRVar1 = (uc->ram_list).mru_block;
  if ((pRVar1 == (RAMBlock *)0x0) || (pRVar1->max_length <= addr - pRVar1->offset)) {
    pRVar1 = (uc->ram_list).blocks.lh_first;
    while( true ) {
      if (pRVar1 == (RAMBlock *)0x0) {
        rVar2 = addr;
        qemu_get_ram_block_cold_1();
        pRVar1 = (RAMBlock *)(addr - *(ulong *)(rVar2 + 8));
        if (addr < *(ulong *)(rVar2 + 8)) {
          __assert_fail("(uintptr_t)host >= (uintptr_t)rb->host",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                        ,0x4c3,"ram_addr_t qemu_ram_block_host_offset_tricore(RAMBlock *, void *)");
        }
        if (pRVar1 < *(RAMBlock **)(rVar2 + 0x20)) {
          return pRVar1;
        }
        __assert_fail("res < rb->max_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                      ,0x4c4,"ram_addr_t qemu_ram_block_host_offset_tricore(RAMBlock *, void *)");
      }
      if (addr - pRVar1->offset < pRVar1->max_length) break;
      pRVar1 = (pRVar1->next).le_next;
    }
    (uc->ram_list).mru_block = pRVar1;
  }
  return pRVar1;
}

Assistant:

static RAMBlock *qemu_get_ram_block(struct uc_struct *uc, ram_addr_t addr)
{
    RAMBlock *block;

    block = uc->ram_list.mru_block;
    if (block && addr - block->offset < block->max_length) {
        return block;
    }
    RAMBLOCK_FOREACH(block) {
        if (addr - block->offset < block->max_length) {
            goto found;
        }
    }

    fprintf(stderr, "Bad ram offset %" PRIx64 "\n", (uint64_t)addr);
    abort();

found:
    uc->ram_list.mru_block = block;
    return block;
}